

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadbase.c
# Opt level: O1

void checkAfkDist(afk_meta_t *d,int x,int z)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int *piVar3;
  int iVar4;
  int z_00;
  uint uVar5;
  uint z_01;
  uint x_00;
  int x_01;
  int iVar6;
  int x_02;
  int iVar8;
  undefined1 auVar7 [16];
  int local_60;
  int local_5c;
  
  iVar6 = 0;
  local_60 = z;
  local_5c = x;
  while( true ) {
    x_00 = x + iVar6;
    z_01 = z + iVar6;
    if ((((int)(z_01 | x_00) < 0) || (d->w <= (int)x_00)) || (d->h <= (int)z_01)) {
      return;
    }
    piVar3 = d->buf;
    uVar5 = d->w * local_60 + local_5c;
    if (piVar3[uVar5] != 0) {
      return;
    }
    iVar4 = blocksInRange(d->p,d->n,d->x0 + x_00,d->z0 + z_01,d->ax,d->az,d->rsq);
    piVar3[(int)uVar5] = iVar4;
    if (iVar4 < d->best) break;
    if (d->best < iVar4) {
      d->best = iVar4;
      d->sumn = 1;
      d->sumx = (long)(int)(d->x0 + x_00);
      d->sumz = (long)(int)(d->z0 + z_01);
    }
    else {
      d->sumn = d->sumn + 1;
      uVar1 = d->x0;
      uVar2 = d->z0;
      iVar8 = x_00 + uVar1;
      auVar7._4_4_ = z_01 + uVar2;
      auVar7._8_4_ = auVar7._4_4_;
      auVar7._12_4_ = -(uint)(auVar7._4_4_ < 0);
      d->sumx = d->sumx + CONCAT44(-(uint)(iVar8 < 0),iVar8);
      d->sumz = d->sumz + auVar7._8_8_;
    }
    iVar4 = z + -1 + iVar6;
    checkAfkDist(d,x_00,iVar4);
    local_60 = local_60 + 1;
    z_00 = z + iVar6 + 1;
    checkAfkDist(d,x_00,z_00);
    x_01 = x + -1 + iVar6;
    checkAfkDist(d,x_01,z_01);
    local_5c = local_5c + 1;
    x_02 = x + iVar6 + 1;
    checkAfkDist(d,x_02,z_01);
    checkAfkDist(d,x_01,iVar4);
    checkAfkDist(d,x_01,z_00);
    checkAfkDist(d,x_02,iVar4);
    iVar6 = iVar6 + 1;
  }
  return;
}

Assistant:

static void checkAfkDist(afk_meta_t *d, int x, int z)
{
    if (x < 0 || z < 0 || x >= d->w || z >= d->h)
        return;
    if (d->buf[z*d->w+x])
        return;

    int q = blocksInRange(d->p, d->n, x+d->x0, z+d->z0, d->ax, d->az, d->rsq);
    d->buf[z*d->w+x] = q;
    if (q >= d->best)
    {
        if (q > d->best)
        {
            d->best = q;
            d->sumn = 1;
            d->sumx = d->x0+x;
            d->sumz = d->z0+z;
        }
        else
        {
            d->sumn += 1;
            d->sumx += d->x0+x;
            d->sumz += d->z0+z;
        }
        checkAfkDist(d, x, z-1);
        checkAfkDist(d, x, z+1);
        checkAfkDist(d, x-1, z);
        checkAfkDist(d, x+1, z);
        checkAfkDist(d, x-1, z-1);
        checkAfkDist(d, x-1, z+1);
        checkAfkDist(d, x+1, z-1);
        checkAfkDist(d, x+1, z+1);
    }
}